

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_properties.cpp
# Opt level: O0

void ON_SetBinaryArchiveOpenNURBSVersion(ON_BinaryArchive *file,uint value)

{
  bool bVar1;
  uint archive_3dm_version;
  uint local_18;
  uint local_14;
  uint n;
  uint value_local;
  ON_BinaryArchive *file_local;
  
  bVar1 = ON_VersionNumberIsValid(value);
  if (bVar1) {
    file->m_3dm_opennurbs_version = value;
  }
  else {
    archive_3dm_version = ON_BinaryArchive::Archive3dmVersion(file);
    bVar1 = ON_VersionNumberIsYearMonthDateFormat(archive_3dm_version,value);
    if (bVar1) {
      local_14 = value;
      if ((value % 10 == 9) && (value < 0xc05e2c0)) {
        local_18 = ON_BinaryArchive::Archive3dmVersion(file);
        if ((0x31 < local_18) && (local_18 % 10 == 0)) {
          local_18 = local_18 / 10;
        }
        if ((local_18 != 0) && (local_18 < 9)) {
          local_14 = (value / 10) * 10 + local_18;
        }
      }
      file->m_3dm_opennurbs_version = local_14;
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_properties.cpp"
                 ,0x1a7,"","ON_SetBinaryArchiveOpenNURBSVersion - invalid opennurbs version");
      file->m_3dm_opennurbs_version = 0;
    }
  }
  return;
}

Assistant:

void ON_SetBinaryArchiveOpenNURBSVersion(ON_BinaryArchive& file, unsigned int value)
{
  if ( ON_VersionNumberIsValid(value) )
  {
    // can be yyyymmddn or a number from ON_VersionNumberConstruct().
    file.m_3dm_opennurbs_version = value;
  }
  else if ( ON_VersionNumberIsYearMonthDateFormat(file.Archive3dmVersion(),value) )
  {
    // can be yyyymmddn or a number from ON_VersionNumberConstruct().
    if ( 9 == (value%10) && value <= 201712319 )
    {
      // 9 marked debug versions.
      unsigned int n = file.Archive3dmVersion();
      if ( n >= 50 && 0 == (n%10) )
        n /= 10;
      if ( n > 0 && n < 9 )
        value = ((value/10)*10) + n;
    }
    file.m_3dm_opennurbs_version = value;
  }
  else
  {
    ON_ERROR("ON_SetBinaryArchiveOpenNURBSVersion - invalid opennurbs version");
    file.m_3dm_opennurbs_version = 0;
  }
}